

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parse.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ostream *poVar2;
  undefined8 extraout_RAX;
  FileInputSource is;
  undefined1 local_130 [16];
  string local_120;
  FileInputSource local_100;
  
  if (argc - 4U < 0xfffffffe) {
    usage();
LAB_0011d57e:
    usage();
    _Unwind_Resume(extraout_RAX);
  }
  filename = argv[1];
  if (argc == 3) {
    iVar1 = strcmp(argv[2],"--react");
    if (iVar1 != 0) goto LAB_0011d57e;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002ed9f0;
    this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Reactor_002eda40;
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  FileInputSource::FileInputSource(&local_100,filename);
  JSON::parse((InputSource *)local_130,(Reactor *)&local_100);
  JSON::unparse_abi_cxx11_(&local_120,(JSON *)local_130);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_120._M_dataplus._M_p,local_120._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
  }
  FileInputSource::~FileInputSource(&local_100);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    if ((argc < 2) || (argc > 3)) {
        usage();
        return 2;
    }
    char const* filename = argv[1];
    std::shared_ptr<Reactor> reactor;
    if (argc == 3) {
        if (strcmp(argv[2], "--react") == 0) {
            reactor = std::make_shared<Reactor>();
        } else {
            usage();
        }
    }
    try {
        FileInputSource is(filename);
        std::cout << JSON::parse(is, reactor.get()).unparse() << std::endl;
    } catch (std::exception& e) {
        std::cerr << "exception: " << filename << ": " << e.what() << std::endl;
        return 2;
    }
    return 0;
}